

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  undefined4 *puVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  FILE *pFVar12;
  N_Vector p_Var13;
  N_Vector p_Var14;
  N_Vector qB;
  N_Vector qB_00;
  char *pcVar15;
  int indexB;
  SUNContext ctx;
  sunrealtype time;
  int ncheck;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  N_Vector local_a8;
  undefined1 local_9c [4];
  long *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 *local_80;
  long *local_78;
  long *local_70;
  N_Vector local_68;
  long local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("-------------------------------------------------\n");
  puts("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0");
  puts("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0");
  puts("               y1  +  y2  +  y3 = 0\n");
  puts("Find dG/dp for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  uVar3 = SUNContext_Create(0,&local_b8);
  if ((int)uVar3 < 0) {
    pcVar15 = "SUNContext_Create";
    goto LAB_001033b9;
  }
  puVar4 = (undefined4 *)malloc(0x18);
  if (puVar4 == (undefined4 *)0x0) {
    main_cold_12();
    return 1;
  }
  *puVar4 = 0x47ae147b;
  puVar4[1] = 0x3fa47ae1;
  puVar4[2] = 0;
  puVar4[3] = 0x40c38800;
  *(undefined8 *)(puVar4 + 4) = 0x417c9c3800000000;
  plVar5 = (long *)N_VNew_Serial(3,local_b8);
  if (plVar5 == (long *)0x0) {
    main_cold_11();
    return 1;
  }
  puVar1 = *(undefined8 **)(*plVar5 + 0x10);
  *puVar1 = 0x3ff0000000000000;
  puVar1[1] = 0;
  puVar1[2] = 0;
  plVar6 = (long *)N_VClone(plVar5);
  if (plVar6 == (long *)0x0) {
    main_cold_10();
    return 1;
  }
  puVar2 = *(undefined4 **)(*plVar6 + 0x10);
  *puVar2 = 0x47ae147b;
  puVar2[1] = 0xbfa47ae1;
  puVar2[2] = 0x47ae147b;
  puVar2[3] = 0x3fa47ae1;
  *(undefined8 *)(puVar2 + 4) = 0;
  plVar7 = (long *)N_VNew_Serial(1,local_b8);
  if (plVar7 == (long *)0x0) {
    main_cold_9();
    return 1;
  }
  **(undefined8 **)(*plVar7 + 0x10) = 0;
  puts("Create and allocate IDAS memory for forward runs");
  lVar8 = IDACreate(local_b8);
  local_38 = lVar8;
  if (lVar8 == 0) {
    main_cold_8();
    return 1;
  }
  uVar3 = IDAInit(0,lVar8,res,plVar5,plVar6);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDAInit";
    goto LAB_001033b9;
  }
  uVar3 = IDAWFtolerances(lVar8,ewt);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDAWFtolerances";
    goto LAB_001033b9;
  }
  uVar3 = IDASetUserData(lVar8,puVar4);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDASetUserData";
    goto LAB_001033b9;
  }
  lVar9 = SUNDenseMatrix(3,3,local_b8);
  if (lVar9 == 0) {
    main_cold_7();
    return 1;
  }
  local_40 = SUNLinSol_Dense(plVar5,lVar9,local_b8);
  if (local_40 == 0) {
    main_cold_6();
    return 1;
  }
  uVar3 = IDASetLinearSolver(lVar8,local_40,lVar9);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDASetLinearSolver";
    goto LAB_001033b9;
  }
  uVar3 = IDASetJacFn(lVar8,Jac);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDASetJacFn";
    goto LAB_001033b9;
  }
  uVar3 = IDAQuadInit(lVar8,rhsQ,plVar7);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDAQuadInit";
    goto LAB_001033b9;
  }
  uVar3 = IDAQuadSStolerances(0xa0b5ed8d,0xa0b5ed8d,lVar8);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDAQuadSStolerances";
    goto LAB_001033b9;
  }
  local_48 = lVar9;
  uVar3 = IDASetQuadErrCon(lVar8,1);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDASetQuadErrCon";
    goto LAB_0010332b;
  }
  uVar3 = IDASetMaxNumSteps(lVar8,0x9c4);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDASetMaxNumSteps";
    goto LAB_001033b9;
  }
  uVar3 = IDAAdjInit(lVar8,100,1);
  if ((int)uVar3 < 0) {
    pcVar15 = "IDAAdjInit";
    goto LAB_0010332b;
  }
  puts("Forward integration ...");
  uVar3 = IDASolveF(0,lVar8,local_b0,plVar5,plVar6,1,local_9c);
  if (-1 < (int)uVar3) {
    local_80 = puVar4;
    uVar10 = N_VClone(plVar5);
    uVar11 = N_VClone(plVar6);
    local_88 = uVar10;
    N_VScale(0,plVar5,uVar10);
    local_90 = uVar11;
    N_VScale(0,plVar6,uVar11);
    uVar3 = IDASolveF(0x20000000,lVar8,local_b0,plVar5,plVar6,1,local_9c);
    if (-1 < (int)uVar3) {
      uVar3 = IDAGetQuad(lVar8,local_b0,plVar7);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDAGetQuad";
        goto LAB_001033b9;
      }
      puts("--------------------------------------------------------");
      local_50 = plVar7;
      printf("G:          %12.4e \n",(int)**(undefined8 **)(*plVar7 + 0x10));
      puts("--------------------------------------------------------");
      puts("\nFinal Statistics:");
      IDAPrintAllStats(lVar8,_stdout,0);
      pFVar12 = fopen("idasRoberts_ASAi_dns_fwd_stats.csv","w");
      IDAPrintAllStats(lVar8,pFVar12,1);
      fclose(pFVar12);
      p_Var13 = (N_Vector)N_VClone(plVar5);
      if (p_Var13 == (N_Vector)0x0) {
        main_cold_5();
        return 1;
      }
      puVar1 = *(undefined8 **)((long)p_Var13->content + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0x3ff0000000000000;
      plVar7 = (long *)N_VClone(plVar5);
      if (plVar7 == (long *)0x0) {
        main_cold_4();
        return 1;
      }
      puVar1 = *(undefined8 **)(*plVar7 + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0x3ff0000000000000;
      puVar1[2] = 0;
      puts("\nCreate and allocate IDAS memory for backward run");
      uVar3 = IDACreateB(lVar8,&local_bc);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDACreateB";
        goto LAB_001033b9;
      }
      uVar3 = IDAInitB(0x20000000,lVar8,local_bc,resB,p_Var13,plVar7);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDAInitB";
        goto LAB_001033b9;
      }
      uVar3 = IDASStolerancesB(0xa0b5ed8d,0xe2308c3a,lVar8,local_bc);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASStolerancesB";
        goto LAB_001033b9;
      }
      uVar3 = IDASetUserDataB(lVar8,local_bc,local_80);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASetUserDataB";
        goto LAB_001033b9;
      }
      uVar3 = IDASetMaxNumStepsB(lVar8,local_bc,1000);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASetMaxNumStepsB";
        goto LAB_001033b9;
      }
      lVar9 = SUNDenseMatrix(3,3,local_b8);
      if (lVar9 == 0) {
        main_cold_3();
        return 1;
      }
      local_60 = SUNLinSol_Dense(p_Var13,lVar9,local_b8);
      if (local_60 == 0) {
        main_cold_2();
        return 1;
      }
      local_58 = lVar9;
      uVar3 = IDASetLinearSolverB(lVar8,local_bc,local_60,lVar9);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASetLinearSolverB";
        goto LAB_001033b9;
      }
      uVar3 = IDASetJacFnB(lVar8,local_bc,JacB);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASetJacFnB";
        goto LAB_001033b9;
      }
      p_Var14 = (N_Vector)N_VNew_Serial(3,local_b8);
      if (p_Var14 == (N_Vector)0x0) {
        main_cold_1();
        return 1;
      }
      puVar1 = *(undefined8 **)((long)p_Var14->content + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      uVar3 = IDAQuadInitB(lVar8,local_bc,rhsQB,p_Var14);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDAQuadInitB";
        goto LAB_001033b9;
      }
      uVar3 = IDAQuadSStolerancesB(0xa0b5ed8d,0xa0b5ed8d,lVar8,local_bc);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDAQuadSStolerancesB";
        goto LAB_001033b9;
      }
      local_a8 = p_Var14;
      uVar3 = IDASetQuadErrConB(lVar8,local_bc,1);
      if ((int)uVar3 < 0) {
        pcVar15 = "IDASetQuadErrConB";
        goto LAB_0010332b;
      }
      puts("Backward integration ...");
      uVar3 = IDASolveB(0,lVar8,1);
      if (-1 < (int)uVar3) {
        uVar3 = IDAGetB(lVar8,local_bc,local_b0,p_Var13,plVar7);
        p_Var14 = local_a8;
        if ((-1 < (int)uVar3) &&
           (uVar3 = IDAGetQuadB(lVar8,local_bc,local_b0,local_a8), -1 < (int)uVar3)) {
          local_70 = plVar6;
          PrintOutput(40000000000.0,p_Var13,p_Var14,qB);
          puts("\nFinal Statistics:");
          uVar10 = IDAGetAdjIDABmem(lVar8,local_bc);
          IDAPrintAllStats(uVar10,_stdout,0);
          pFVar12 = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv","w");
          local_98 = plVar7;
          local_68 = p_Var13;
          uVar10 = IDAGetAdjIDABmem(lVar8,local_bc);
          IDAPrintAllStats(uVar10,pFVar12,1);
          p_Var14 = local_68;
          plVar6 = local_98;
          fclose(pFVar12);
          puts("\nRe-initialize IDAS memory for backward run");
          p_Var13 = local_a8;
          puVar1 = *(undefined8 **)((long)p_Var14->content + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0x3fe0000000000000;
          puVar4 = *(undefined4 **)(*plVar6 + 0x10);
          *puVar4 = 0x9999999a;
          puVar4[1] = 0x3fe99999;
          puVar4[2] = 0;
          puVar4[3] = 0x3fe80000;
          *(undefined8 *)(puVar4 + 4) = 0;
          puVar1 = *(undefined8 **)((long)local_a8->content + 0x10);
          puVar1[2] = 0;
          *puVar1 = 0;
          puVar1[1] = 0;
          uVar3 = IDAReInitB(0,lVar8,local_bc,p_Var14,plVar6);
          if ((int)uVar3 < 0) {
            pcVar15 = "IDAReInitB";
            goto LAB_0010332b;
          }
          uVar3 = IDAQuadReInitB(lVar8,local_bc,p_Var13);
          if ((int)uVar3 < 0) {
            pcVar15 = "IDAQuadReInitB";
            goto LAB_001033b9;
          }
          plVar7 = (long *)N_VClone(plVar5);
          puVar4 = *(undefined4 **)(*plVar7 + 0x10);
          *puVar4 = 0;
          puVar4[1] = 0x3ff00000;
          puVar4[2] = 0;
          puVar4[3] = 0x3ff00000;
          *(undefined8 *)(puVar4 + 4) = 0;
          uVar3 = IDASetIdB(lVar8,local_bc,plVar7);
          if ((int)uVar3 < 0) {
            pcVar15 = "IDASetId";
            goto LAB_001033b9;
          }
          uVar3 = IDACalcICB(0,lVar8,local_bc,local_88,local_90);
          if ((int)uVar3 < 0) {
            pcVar15 = "IDACalcICB";
            goto LAB_001033b9;
          }
          uVar3 = IDAGetConsistentICB(lVar8,local_bc,p_Var14,plVar6);
          if ((int)uVar3 < 0) {
            pcVar15 = "IDAGetConsistentICB";
            goto LAB_001033b9;
          }
          local_78 = plVar7;
          uVar3 = IDASolveB(0,lVar8,1);
          if ((int)uVar3 < 0) goto LAB_00103254;
          uVar3 = IDAGetB(lVar8,local_bc,local_b0,p_Var14,plVar6);
          p_Var13 = local_a8;
          if (-1 < (int)uVar3) {
            uVar3 = IDAGetQuadB(lVar8,local_bc,local_b0,local_a8);
            if (-1 < (int)uVar3) {
              PrintOutput(50.0,p_Var14,p_Var13,qB_00);
              puts("\nFinal Statistics:");
              uVar10 = IDAGetAdjIDABmem(lVar8,local_bc);
              IDAPrintAllStats(uVar10,_stdout,0);
              pFVar12 = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv","w");
              uVar10 = IDAGetAdjIDABmem(lVar8,local_bc);
              IDAPrintAllStats(uVar10,pFVar12,1);
              fclose(pFVar12);
              IDAFree(&local_38);
              SUNLinSolFree(local_40);
              SUNMatDestroy(local_48);
              SUNLinSolFree(local_60);
              SUNMatDestroy(local_58);
              N_VDestroy(plVar5);
              N_VDestroy(local_70);
              N_VDestroy(local_50);
              N_VDestroy(p_Var14);
              N_VDestroy(local_98);
              N_VDestroy(local_a8);
              N_VDestroy(local_78);
              N_VDestroy(local_88);
              N_VDestroy(local_90);
              free(local_80);
              SUNContext_Free(&local_b8);
              return 0;
            }
            pcVar15 = "IDAGetQuadB";
            goto LAB_001033b9;
          }
        }
        pcVar15 = "IDAGetB";
LAB_001033b9:
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar15,(ulong)uVar3);
        return 1;
      }
LAB_00103254:
      pcVar15 = "IDASolveB";
      goto LAB_0010332b;
    }
  }
  pcVar15 = "IDASolveF";
LAB_0010332b:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar15,(ulong)uVar3);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;

  UserData data;

  void* ida_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype reltolQ, abstolQ;
  N_Vector yy, yp, q;
  N_Vector yyTB1, ypTB1;
  N_Vector id;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, ypB, qB;
  sunrealtype time;
  int retval, ncheck;

  IDAadjCheckPointRec* ckpnt;

  FILE* FID;

  data    = NULL;
  ckpnt   = NULL;
  ida_mem = NULL;
  A = AB = NULL;
  LS = LSB = NULL;
  yy = yp = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("DAE: dy1/dt + p1*y1 - p2*y2*y3 = 0\n");
  printf("     dy2/dt - p1*y1 + p2*y2*y3 + p3*(y2)^2 = 0\n");
  printf("               y1  +  y2  +  y3 = 0\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Initialize y */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  Ith(yy, 1) = ONE;
  Ith(yy, 2) = ZERO;
  Ith(yy, 3) = ZERO;

  /* Initialize yprime */
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  Ith(yp, 1) = SUN_RCONST(-0.04);
  Ith(yp, 2) = SUN_RCONST(0.04);
  Ith(yp, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLQ;

  /* Create and allocate IDAS memory for forward run */
  printf("Create and allocate IDAS memory for forward runs\n");

  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(ida_mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDAWFtolerances(ida_mem, ewt);
  if (check_retval(&retval, "IDAWFtolerances", 1)) { return (1); }

  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(ida_mem, Jac);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Setup quadrature integration */
  retval = IDAQuadInit(ida_mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  retval = IDAQuadSStolerances(ida_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(ida_mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Call IDASetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = IDASetMaxNumSteps(ida_mem, 2500);
  if (check_retval(&retval, "IDASetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  steps  = STEPS;
  retval = IDAAdjInit(ida_mem, steps, IDA_HERMITE);
  /*retval = IDAAdjInit(ida_mem, steps, IDA_POLYNOMIAL);*/
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ...\n");

  /* Integrate till TB1 and get the solution (y, y') at that time. */
  retval = IDASolveF(ida_mem, TB1, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  yyTB1 = N_VClone(yy);
  ypTB1 = N_VClone(yp);
  /* Save the states at t=TB1. */
  N_VScale(ONE, yy, yyTB1);
  N_VScale(ONE, yp, ypTB1);

  /* Continue integrating till TOUT is reached. */
  retval = IDASolveF(ida_mem, TOUT, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetQuad(ida_mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (IDAadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(IDAadjCheckPointRec));
    IDAGetAdjCheckPointsInfo(ida_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Create BACKWARD problem. */

  /* Allocate yB (i.e. lambda_0). */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize yB. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ONE;

  /* Allocate ypB (i.e. lambda'_0). */
  ypB = N_VClone(yy);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }

  /* Consistently initialize ypB. */
  Ith(ypB, 1) = ONE;
  Ith(ypB, 2) = ONE;
  Ith(ypB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLA;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLQ;

  /* Create and allocate IDAS memory for backward run */
  printf("\nCreate and allocate IDAS memory for backward run\n");

  retval = IDACreateB(ida_mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(ida_mem, indexB, resB, TB2, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(ida_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(ida_mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(ida_mem, indexB, 1000);
  if (check_retval(&retval, "IDASetMaxNumStepsB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(ida_mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFnB(ida_mem, indexB, JacB);
  if (check_retval(&retval, "IDASetJacFnB", 1)) { return (1); }

  /* Quadrature for backward problem. */

  /* Initialize qB */
  qB = N_VNew_Serial(NP, ctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAQuadInitB(ida_mem, indexB, rhsQB, qB);
  if (check_retval(&retval, "IDAQuadInitB", 1)) { return (1); }

  retval = IDAQuadSStolerancesB(ida_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "IDAQuadSStolerancesB", 1)) { return (1); }

  /* Include quadratures in error control. */
  retval = IDASetQuadErrConB(ida_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrConB", 1)) { return (1); }

  /* Backward Integration */
  printf("Backward integration ...\n");

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(TB2, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase and start from a different time (TB1). */
  printf("\nRe-initialize IDAS memory for backward run\n");

  /* Both algebraic part from y and the entire y' are computed by IDACalcIC. */
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = SUN_RCONST(0.50); /* not consistent */

  /* Rough guess for ypB. */
  Ith(ypB, 1) = SUN_RCONST(0.80);
  Ith(ypB, 2) = SUN_RCONST(0.75);
  Ith(ypB, 3) = ZERO;

  /* Initialize qB */
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  retval = IDAReInitB(ida_mem, indexB, TB1, yB, ypB);
  if (check_retval(&retval, "IDAReInitB", 1)) { return (1); }

  /* Also reinitialize quadratures. */
  retval = IDAQuadReInitB(ida_mem, indexB, qB);
  if (check_retval(&retval, "IDAQuadReInitB", 1)) { return (1); }

  /* Use IDACalcICB to compute consistent initial conditions
     for this backward problem. */

  id         = N_VClone(yy);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;

  /* Specify which variables are differential (1) and which algebraic (0).*/
  retval = IDASetIdB(ida_mem, indexB, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDACalcICB(ida_mem, indexB, T1B, yyTB1, ypTB1);
  if (check_retval(&retval, "IDACalcICB", 1)) { return (1); }

  /* Get the consistent IC found by IDAS. */
  retval = IDAGetConsistentICB(ida_mem, indexB, yB, ypB);
  if (check_retval(&retval, "IDAGetConsistentICB", 1)) { return (1); }

  retval = IDASolveB(ida_mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  retval = IDAGetB(ida_mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  retval = IDAGetQuadB(ida_mem, indexB, &time, qB);
  if (check_retval(&retval, "IDAGetQuadB", 1)) { return (1); }

  PrintOutput(TB1, yB, ypB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), stdout,
                            SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = IDAPrintAllStats(IDAGetAdjIDABmem(ida_mem, indexB), FID,
                            SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free any memory used.*/

  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(qB);
  N_VDestroy(id);
  N_VDestroy(yyTB1);
  N_VDestroy(ypTB1);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}